

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_substring_indexBeyondBounds_fn(int _i)

{
  int iVar1;
  AString *pAVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 0x10;
  string.capacity = 0x10;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14eb40;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x11);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"xxxx01234567xxxx",0x11);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x14eb82;
  pAVar2 = AString_substring(&string,0x10,0xffffffffffffffff);
  if (pAVar2 == (AString *)0x0) {
    ppcVar4 = &local_58;
    pcVar6 = "Assertion \'_ck_x != NULL\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) substring != NULL";
    pcVar9 = "(void*) substring";
    iVar1 = 0x9bd;
    goto LAB_0014f212;
  }
  uStack_50 = 0x14eb9f;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9bd);
  pcVar8 = (char *)pAVar2->capacity;
  if (pcVar8 != (char *)0x8) {
    iVar1 = 0x9be;
LAB_0014f0ce:
    local_60 = "(8)";
    pcVar7 = "(*substring).capacity";
    pcVar6 = "(*substring).capacity == (8)";
    local_58 = (char *)0x8;
LAB_0014f2ac:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
    goto LAB_0014f2ae;
  }
  uStack_50 = 0x14ebbe;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  if (pAVar2->buffer == (char *)0x0) {
    ppcVar4 = &local_58;
    pcVar6 = "Assertion \'_ck_x != NULL\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (*substring).buffer != NULL";
    pcVar9 = "(void*) (*substring).buffer";
LAB_0014ef69:
    iVar1 = 0x9be;
LAB_0014f212:
    uStack_50 = 0;
    local_58 = (char *)0x0;
    *(undefined8 *)((long)ppcVar4 + -8) = 0x14f219;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar1,pcVar6,pcVar8,pcVar7,pcVar9);
  }
  uStack_50 = 0x14ebda;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  pcVar8 = pAVar2->buffer;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "(null)";
    pcStack_78 = "";
LAB_0014eedf:
    uStack_50 = 0;
    local_58 = "\"";
    local_60 = "";
    local_68 = "\"";
    pcStack_70 = "(\"\")";
    pcStack_80 = pcVar8;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9be,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "(*substring).buffer == (\"\")","(*substring).buffer",pcStack_78);
  }
  if (*pcVar8 != '\0') {
    pcStack_78 = "\"";
    goto LAB_0014eedf;
  }
  uStack_50 = 0x14ec09;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  if ((char *)pAVar2->size != (char *)0x0) {
    ppcVar4 = &local_68;
    local_60 = "strlen(\"\")";
    pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar7 = "(*substring).size == strlen(\"\")";
    pcVar9 = "(*substring).size";
    local_68 = (char *)pAVar2->size;
    goto LAB_0014ef69;
  }
  uStack_50 = 0x14ec27;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9be);
  if (string.capacity != 0x10) {
    local_60 = "(16)";
    pcVar6 = "(string).capacity == (16)";
    pcVar7 = "(string).capacity";
    pcVar8 = (char *)string.capacity;
LAB_0014f05d:
    iVar1 = 0x9bf;
LAB_0014f2a6:
    local_58 = (char *)0x10;
    goto LAB_0014f2ac;
  }
  uStack_50 = 0x14ec47;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9bf);
  if (string.buffer == (char *)0x0) {
    ppcVar4 = &local_58;
    pcVar6 = "Assertion \'_ck_x != NULL\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %#x";
    pcVar7 = "(void*) (string).buffer != NULL";
    pcVar9 = "(void*) (string).buffer";
    iVar1 = 0x9bf;
    goto LAB_0014f212;
  }
  uStack_50 = 0x14ec64;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9bf);
  pcVar9 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar8 = "";
    pcVar9 = "(null)";
LAB_0014eff1:
    iVar1 = 0x9bf;
  }
  else {
    uStack_50 = 0x14ec84;
    iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
    if (iVar1 != 0) {
      pcVar8 = "\"";
      goto LAB_0014eff1;
    }
    uStack_50 = 0x14ec9d;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9bf);
    if (string.size != 0x10) {
      local_60 = "strlen(\"xxxx01234567xxxx\")";
      pcVar6 = "(string).size == strlen(\"xxxx01234567xxxx\")";
      pcVar7 = "(string).size";
      pcVar8 = (char *)string.size;
      goto LAB_0014f05d;
    }
    uStack_50 = 0x14ecbd;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9bf);
    uStack_50 = 0x14ecc5;
    AString_destruct(pAVar2);
    uStack_50 = 0x14ecd9;
    pAVar2 = AString_substring(&string,0xffffffffffffffff,4);
    if (pAVar2 == (AString *)0x0) {
      ppcVar4 = &local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar8 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) substring != NULL";
      pcVar9 = "(void*) substring";
      iVar1 = 0x9c2;
      goto LAB_0014f212;
    }
    uStack_50 = 0x14ecf6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c2);
    pcVar8 = (char *)pAVar2->capacity;
    if (pcVar8 != (char *)0x8) {
      iVar1 = 0x9c3;
      goto LAB_0014f0ce;
    }
    uStack_50 = 0x14ed15;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c3);
    if (pAVar2->buffer == (char *)0x0) {
      ppcVar4 = &local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar8 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (*substring).buffer != NULL";
      pcVar9 = "(void*) (*substring).buffer";
LAB_0014f1a9:
      iVar1 = 0x9c3;
      goto LAB_0014f212;
    }
    uStack_50 = 0x14ed31;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c3);
    pcVar8 = pAVar2->buffer;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "(null)";
      pcStack_78 = "";
LAB_0014f11f:
      uStack_50 = 0;
      local_58 = "\"";
      local_60 = "";
      local_68 = "\"";
      pcStack_70 = "(\"\")";
      pcStack_80 = pcVar8;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9c3,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(*substring).buffer == (\"\")","(*substring).buffer",pcStack_78);
    }
    if (*pcVar8 != '\0') {
      pcStack_78 = "\"";
      goto LAB_0014f11f;
    }
    uStack_50 = 0x14ed60;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c3);
    if ((char *)pAVar2->size != (char *)0x0) {
      ppcVar4 = &local_68;
      local_60 = "strlen(\"\")";
      pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar7 = "(*substring).size == strlen(\"\")";
      pcVar9 = "(*substring).size";
      local_68 = (char *)pAVar2->size;
      goto LAB_0014f1a9;
    }
    uStack_50 = 0x14ed7e;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c3);
    if (string.capacity != 0x10) {
      local_60 = "(16)";
      pcVar6 = "(string).capacity == (16)";
      pcVar7 = "(string).capacity";
      pcVar8 = (char *)string.capacity;
LAB_0014f2a1:
      iVar1 = 0x9c4;
      goto LAB_0014f2a6;
    }
    uStack_50 = 0x14ed9e;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c4);
    if (string.buffer == (char *)0x0) {
      ppcVar4 = &local_58;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar8 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (string).buffer != NULL";
      pcVar9 = "(void*) (string).buffer";
      iVar1 = 0x9c4;
      goto LAB_0014f212;
    }
    uStack_50 = 0x14edbb;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9c4);
    pcVar9 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar8 = "";
    }
    else {
      uStack_50 = 0x14edd8;
      iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
      if (iVar1 == 0) {
        uStack_50 = 0x14edf1;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x9c4);
        if (string.size == 0x10) {
          uStack_50 = 0x14ee11;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9c4);
          uStack_50 = 0x14ee19;
          AString_destruct(pAVar2);
          uStack_50 = 0x14ee22;
          (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
          return;
        }
        local_60 = "strlen(\"xxxx01234567xxxx\")";
        pcVar6 = "(string).size == strlen(\"xxxx01234567xxxx\")";
        pcVar7 = "(string).size";
        pcVar8 = (char *)string.size;
        goto LAB_0014f2a1;
      }
      pcVar8 = "\"";
    }
    iVar1 = 0x9c4;
  }
  pcVar7 = "(string).buffer";
  pcVar6 = "(string).buffer == (\"xxxx01234567xxxx\")";
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  local_60 = "xxxx01234567xxxx";
  local_68 = "\"";
  pcStack_70 = "(\"xxxx01234567xxxx\")";
  ppcVar5 = &pcStack_80;
  pcStack_80 = pcVar9;
  pcStack_78 = pcVar8;
LAB_0014f2ae:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) = test_AString_substring_reallocationFailed_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_substring_indexBeyondBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("xxxx01234567xxxx", 16);
    struct AString *substring;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    substring = AString_substring(&string, 16, -1);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, -1, 4);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    AString_destruct(substring);
    private_ACUtilsTest_AString_destructTestString(string);
}